

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void QDir::setSearchPaths(QString *prefix,QStringList *searchPaths)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator pQVar3;
  Type *pTVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  DirSearchPaths *conf;
  const_iterator __end1;
  const_iterator __begin1;
  QString *__range1;
  QWriteLocker lock;
  QChar ch;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  const_iterator local_78;
  QMessageLogger local_50;
  char16_t local_2a;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QString::size(in_RDI);
  if (qVar2 < 2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (char *)in_stack_ffffffffffffff38);
    QMessageLogger::warning
              (&local_28,"QDir::setSearchPaths: Prefix must be longer than 1 character");
  }
  else {
    local_78 = QString::begin((QString *)0x27edda);
    pQVar3 = QString::end((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    for (; local_78 != pQVar3; local_78 = local_78 + 1) {
      local_2a = local_78->ucs;
      bVar1 = QChar::isLetterOrNumber((QChar *)0x27ee26);
      if (!bVar1) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                   (char *)in_stack_ffffffffffffff38);
        QMessageLogger::warning
                  (&local_50,"QDir::setSearchPaths: Prefix can only contain letters or numbers");
        goto LAB_0027ef29;
      }
    }
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
             operator*((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                        *)0x27ee82);
    QWriteLocker::QWriteLocker
              ((QWriteLocker *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (QReadWriteLock *)in_stack_ffffffffffffff38);
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0x27eeac);
    if (bVar1) {
      QHash<QString,_QList<QString>_>::remove(&pTVar4->paths,(char *)in_RDI);
    }
    else {
      QHash<QString,_QList<QString>_>::insert
                ((QHash<QString,_QList<QString>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38,(QList<QString> *)0x27eeff);
    }
    QWriteLocker::~QWriteLocker((QWriteLocker *)0x27ef29);
  }
LAB_0027ef29:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDir::setSearchPaths(const QString &prefix, const QStringList &searchPaths)
{
    if (prefix.size() < 2) {
        qWarning("QDir::setSearchPaths: Prefix must be longer than 1 character");
        return;
    }

    for (QChar ch : prefix) {
        if (!ch.isLetterOrNumber()) {
            qWarning("QDir::setSearchPaths: Prefix can only contain letters or numbers");
            return;
        }
    }

    DirSearchPaths &conf = *dirSearchPaths;
    const QWriteLocker lock(&conf.mutex);
    if (searchPaths.isEmpty()) {
        conf.paths.remove(prefix);
    } else {
        conf.paths.insert(prefix, searchPaths);
    }
}